

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ThreadSafeArena::InitializeWithPolicy
          (ThreadSafeArena *this,AllocationPolicy *policy)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  _func_void_void_ptr_size_t *p_Var5;
  bool bVar6;
  uint64_t uVar7;
  uint uVar8;
  long *in_FS_OFFSET;
  void *p;
  LogMessage local_30;
  size_t *local_20;
  
  lVar1 = *in_FS_OFFSET;
  uVar7 = in_FS_OFFSET[-0x10];
  if ((char)uVar7 == '\0') {
    LOCK();
    UNLOCK();
    uVar7 = lifecycle_id_ << 8;
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  in_FS_OFFSET[-0x10] = uVar7 + 1;
  this->tag_and_id_ = uVar7;
  (this->head_)._M_b._M_p = (__pointer_type)kSentryArenaChunk;
  this->first_owner_ = (void *)(lVar1 + -0x80);
  in_FS_OFFSET[-0xe] = (long)&this->first_arena_;
  in_FS_OFFSET[-0xf] = uVar7;
  if ((((policy->start_block_size == 0x100) && (policy->max_block_size == 0x8000)) &&
      (policy->block_alloc == (_func_void_ptr_size_t *)0x0)) &&
     (policy->block_dealloc == (_func_void_void_ptr_size_t *)0x0)) {
    return;
  }
  uVar2 = (this->alloc_policy_).policy_;
  bVar6 = SerialArena::MaybeAllocateAligned(&this->first_arena_,0x20,&local_20);
  if (bVar6) {
    sVar3 = policy->start_block_size;
    sVar4 = policy->max_block_size;
    p_Var5 = policy->block_dealloc;
    local_20[2] = (size_t)policy->block_alloc;
    local_20[3] = (size_t)p_Var5;
    *local_20 = sVar3;
    local_20[1] = sVar4;
    if (((ulong)local_20 & 3) == 0) {
      uVar8 = (uint)(this->alloc_policy_).policy_;
      (this->alloc_policy_).policy_ = (ulong)(uVar8 & 7) | (ulong)local_20;
      if (uVar2 < 4) {
        return;
      }
      if (((uint)uVar2 & 3) == (uVar8 & 3)) {
        return;
      }
    }
    else {
      InitializeWithPolicy();
    }
    InitializeWithPolicy();
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
               ,0x27d);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_30,(char (*) [39])"MaybeAllocateAligned cannot fail here.");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

void ThreadSafeArena::InitializeWithPolicy(const AllocationPolicy& policy) {
  Init();

  if (policy.IsDefault()) return;

#ifndef NDEBUG
  const uint64_t old_alloc_policy = alloc_policy_.get_raw();
  // If there was a policy (e.g., in Reset()), make sure flags were preserved.
#define ABSL_DCHECK_POLICY_FLAGS_() \
  if (old_alloc_policy > 3)         \
  ABSL_CHECK_EQ(old_alloc_policy & 3, alloc_policy_.get_raw() & 3)
#else
#define ABSL_DCHECK_POLICY_FLAGS_()
#endif  // NDEBUG

  // We ensured enough space so this cannot fail.
  void* p;
  if (!first_arena_.MaybeAllocateAligned(kAllocPolicySize, &p)) {
    ABSL_LOG(FATAL) << "MaybeAllocateAligned cannot fail here.";
    return;
  }
  new (p) AllocationPolicy{policy};
  // Low bits store flags, so they mustn't be overwritten.
  ABSL_DCHECK_EQ(0u, reinterpret_cast<uintptr_t>(p) & 3);
  alloc_policy_.set_policy(reinterpret_cast<AllocationPolicy*>(p));
  ABSL_DCHECK_POLICY_FLAGS_();

#undef ABSL_DCHECK_POLICY_FLAGS_
}